

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall cmm::BinaryOperatorAST::dump(BinaryOperatorAST *this,string *prefix)

{
  OperatorKind OVar1;
  ostream *poVar2;
  pointer pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_38 [8];
  string OperatorSymbol;
  string *prefix_local;
  BinaryOperatorAST *this_local;
  
  OperatorSymbol.field_2._8_8_ = prefix;
  std::__cxx11::string::string(local_38);
  OVar1 = getOpKind(this);
  switch(OVar1) {
  case Add:
    std::__cxx11::string::operator=(local_38,"Add");
    break;
  case Minus:
    std::__cxx11::string::operator=(local_38,"Sub");
    break;
  case Multiply:
    std::__cxx11::string::operator=(local_38,"Mul");
    break;
  case Division:
    std::__cxx11::string::operator=(local_38,"Div");
    break;
  case Modulo:
    std::__cxx11::string::operator=(local_38,"Mod");
    break;
  case LogicalAnd:
    std::__cxx11::string::operator=(local_38,"And");
    break;
  case LogicalOr:
    std::__cxx11::string::operator=(local_38,"Or");
    break;
  case Less:
    std::__cxx11::string::operator=(local_38,"Less");
    break;
  case LessEqual:
    std::__cxx11::string::operator=(local_38,"LessEq");
    break;
  case Equal:
    std::__cxx11::string::operator=(local_38,"Equal");
    break;
  case NotEqual:
    std::__cxx11::string::operator=(local_38,"NotEq");
    break;
  case Greater:
    std::__cxx11::string::operator=(local_38,"Greater");
    break;
  case GreaterEqual:
    std::__cxx11::string::operator=(local_38,"GreaterEq");
    break;
  case BitwiseAnd:
    std::__cxx11::string::operator=(local_38,"BitAnd");
    break;
  case BitwiseOr:
    std::__cxx11::string::operator=(local_38,"BitOr");
    break;
  case BitwiseXor:
    std::__cxx11::string::operator=(local_38,"Xor");
    break;
  case LeftShift:
    std::__cxx11::string::operator=(local_38,"LShift");
    break;
  case RightShift:
    std::__cxx11::string::operator=(local_38,"RShift");
    break;
  case Assign:
    std::__cxx11::string::operator=(local_38,"Assign");
    break;
  case Index:
    std::__cxx11::string::operator=(local_38,"At");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,local_38);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)OperatorSymbol.field_2._8_8_);
  std::operator<<(poVar2,"|---");
  pEVar3 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (&this->LHS);
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 OperatorSymbol.field_2._8_8_,"|   ");
  (*(pEVar3->super_AST)._vptr_AST[2])(pEVar3,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)OperatorSymbol.field_2._8_8_);
  std::operator<<(poVar2,"`---");
  pEVar3 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (&this->RHS);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 OperatorSymbol.field_2._8_8_,"    ");
  (*(pEVar3->super_AST)._vptr_AST[2])(pEVar3,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void BinaryOperatorAST::dump(const std::string &prefix) const
{
  std::string OperatorSymbol;

  switch (getOpKind()) {
  default: break;
  case Add:           OperatorSymbol = "Add"; break;
  case Minus:         OperatorSymbol = "Sub"; break;
  case Multiply:      OperatorSymbol = "Mul"; break;
  case Division:      OperatorSymbol = "Div"; break;
  case Modulo:        OperatorSymbol = "Mod"; break;
  case LogicalAnd:    OperatorSymbol = "And"; break;
  case LogicalOr:     OperatorSymbol = "Or"; break;
  case Less:          OperatorSymbol = "Less"; break;
  case LessEqual:     OperatorSymbol = "LessEq"; break;
  case Equal:         OperatorSymbol = "Equal"; break;
  case NotEqual:      OperatorSymbol = "NotEq"; break;
  case Greater:       OperatorSymbol = "Greater"; break;
  case BitwiseAnd:    OperatorSymbol = "BitAnd"; break;
  case BitwiseOr:     OperatorSymbol = "BitOr"; break;
  case BitwiseXor:    OperatorSymbol = "Xor"; break;
  case LeftShift:     OperatorSymbol = "LShift"; break;
  case RightShift:    OperatorSymbol = "RShift"; break;
  case Assign:        OperatorSymbol = "Assign"; break;
  case GreaterEqual:  OperatorSymbol = "GreaterEq"; break;
  case Index:         OperatorSymbol = "At"; break;
  }

  std::cout << OperatorSymbol << "\n";

  std::cout << prefix << "|---";
  LHS->dump(prefix + "|   ");

  std::cout << prefix << "`---";
  RHS->dump(prefix + "    ");
}